

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void SPARSITY_INFO(int *nJdata,int *consP,int NCELLS)

{
  int iVar1;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int l;
  int k_10;
  int nJdata_tmp;
  int n;
  GpuArray<double,_9U> conc;
  GpuArray<double,_100U> Jac;
  int m;
  int k_9;
  Real dehmixdc;
  Real tmp2;
  Real tmp3;
  Real tmp1;
  Real cmixinv;
  int k_8;
  Real dehmixdT;
  Real dcmixdT;
  Real ehmix;
  Real cmix;
  Real *eh_RT;
  Real e_RT [9];
  Real dcRdT [9];
  Real c_R [9];
  int k_7;
  int k_6;
  int k_5;
  int k_4;
  int k_3;
  int k_2;
  Real log10e;
  Real ln10;
  Real dlnCorrdT;
  Real dlogFdlogPr;
  Real dlogFcentdT;
  Real dlogFdT;
  Real dlogfPrdT;
  Real dlogPrdT;
  Real dlogFdcn_fac;
  Real dlogFdn;
  Real dlogFdc;
  Real Fcent;
  Real Fcent3;
  Real Fcent2;
  Real Fcent1;
  Real troe;
  Real troePr;
  Real troePr_den;
  Real troe_n;
  Real troe_c;
  Real logFcent;
  Real logPr;
  Real k_0;
  Real F;
  Real fPr;
  Real Pr;
  Real dqdc [9];
  Real dcdc_fac;
  Real dqdci;
  Real dqdT;
  Real dkrdT;
  Real dlnKcdT;
  Real dlnk0dT;
  Real dlnkfdT;
  Real alpha;
  Real Corr;
  Real q_nocor;
  Real q;
  Real Kc;
  Real phi_r;
  Real k_r;
  Real k_f;
  Real phi_f;
  Real h_RT [9];
  Real g_RT [9];
  int k_1;
  Real mixture;
  Real refCinv;
  Real refC;
  Real invT2;
  Real invT;
  Real tc [5];
  int k;
  Real wdot [9];
  int i;
  Real invT_1;
  Real T;
  Real invT_2;
  Real T_1;
  Real T_2;
  Real T_3;
  Real T_5;
  Real T_4;
  Real invT_3;
  Real T_6;
  int local_8f8;
  int local_8f4;
  int local_8f0;
  int local_8ec;
  double local_8e8 [9];
  double local_8a0 [100];
  int local_57c;
  int *local_578;
  int *local_570;
  undefined4 local_564;
  double *local_560;
  int local_554;
  double *local_550;
  int local_548;
  int local_544;
  double local_540;
  double local_538;
  double local_530;
  double local_528;
  double local_520;
  int local_514;
  double local_510;
  double local_508;
  double local_500;
  double local_4f8;
  double *local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_498 [10];
  double local_448 [9];
  int local_400;
  int local_3fc;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  int local_3ec;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  undefined8 local_388;
  double local_380;
  double local_378;
  double local_370;
  double local_368;
  double local_360;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318 [10];
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_1f8;
  double local_1f0;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  int local_1a4;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  int local_14c;
  double local_148 [9];
  int local_100;
  int local_fc;
  double local_f8;
  double *local_f0;
  double *local_e8;
  double local_e0;
  double local_d8;
  double *local_d0;
  double *local_c8;
  undefined4 local_ac;
  double *local_a8;
  double local_a0;
  double local_98;
  double *local_90;
  double *local_88;
  double local_80;
  double *local_78;
  double *local_70;
  double local_38;
  double *local_30;
  double *local_28;
  double local_20;
  double local_18;
  double *local_10;
  double *local_8;
  
  local_57c = in_EDX;
  local_578 = in_RSI;
  local_570 = in_RDI;
  memset(local_8a0,0,800);
  memset(local_8e8,0,0x48);
  for (local_8ec = 0; local_8ec < 9; local_8ec = local_8ec + 1) {
    local_554 = local_8ec;
    local_550 = local_8e8;
    local_550[local_8ec] = 0.1111111111111111;
  }
  local_e8 = local_8a0;
  local_ac = 0;
  local_560 = local_8e8;
  local_564 = 0;
  local_fc = *local_578;
  local_f8 = 1500.0;
  for (local_100 = 0; local_100 < 100; local_100 = local_100 + 1) {
    local_e8[local_100] = 0.0;
  }
  for (local_14c = 0; local_14c < 9; local_14c = local_14c + 1) {
    local_148[local_14c] = 0.0;
  }
  local_f0 = local_560;
  local_a8 = local_e8;
  dVar2 = log(1500.0);
  local_170 = local_f8;
  dVar3 = local_f8 * local_f8;
  dVar4 = local_f8 * local_f8 * local_f8;
  dVar5 = local_f8 * local_f8 * local_f8 * local_f8;
  local_180 = 1.0 / local_f8;
  local_188 = local_180 * local_180;
  local_190 = 12186.6002121605 / local_f8;
  local_198 = 1.0 / local_190;
  local_1a0 = 0.0;
  for (local_1a4 = 0; local_1a4 < 9; local_1a4 = local_1a4 + 1) {
    local_1a0 = local_f0[local_1a4] + local_1a0;
  }
  local_c8 = &local_1f8;
  local_d0 = &local_178;
  local_d8 = local_f8;
  local_e0 = 1.0 / local_f8;
  if (1000.0 <= local_f8) {
    local_1f8 = dVar5 * -7.91375895e-17 +
                dVar4 * 7.692981816666667e-13 +
                dVar3 * 9.389714483333333e-09 +
                local_f8 * -0.0003500322055 +
                dVar2 * -2.99142337 + local_e0 * -835.033997 + 4.34653354;
    local_1f0 = local_158 * 5.68217655e-17 +
                local_160 * -1.479401233333333e-12 +
                local_168 * 2.098069983333333e-08 +
                local_f8 * -0.0003067598445 +
                local_178 * -3.69757819 + local_e0 * -1233.93018 + 0.5084126000000002;
    local_1e8 = local_158 * 3.195808935e-16 +
                local_160 * -1.000830325e-11 +
                local_168 * 1.455043351666667e-07 +
                local_f8 * -0.001528146445 +
                local_178 * -2.67214561 + local_e0 * -29899.209 + -4.190671200000001;
    local_1e0 = local_158 * -0.0 +
                local_160 * -0.0 +
                local_168 * -0.0 +
                local_f8 * -0.0 + local_178 * -2.5 + local_e0 * 25471.627 + 2.960117638;
    local_1d8 = local_158 * 2.18402575e-17 +
                local_160 * -3.792556183333333e-13 +
                local_168 * 5.171338916666667e-10 +
                local_f8 * 1.377530955e-05 +
                local_178 * -2.54205966 + local_e0 * 29230.8027 + -2.37824845;
    local_1d0 = local_158 * 6.6597938e-17 +
                local_160 * -2.54348895e-12 +
                local_168 * 4.318045966666667e-08 +
                local_f8 * -0.00052825224 +
                local_178 * -2.86472886 + local_e0 * 3683.62875 + -2.83691187;
    local_1c8 = local_158 * 5.39542675e-16 +
                local_160 * -9.520530833333334e-12 +
                local_168 * 1.056096916666667e-07 +
                local_f8 * -0.001119910065 +
                local_178 * -4.0172109 + local_e0 * 111.856713 + 0.2321087500000001;
    local_1c0 = local_158 * 7.1582678e-16 +
                local_160 * -1.957419641666667e-11 +
                local_168 * 2.4578147e-07 +
                local_f8 * -0.002168068195 +
                local_178 * -4.57316685 + local_e0 * -18006.9609 + 4.072029891;
    local_1b8 = local_158 * 3.3766755e-16 +
                local_160 * -8.4142e-12 +
                local_168 * 9.474601666666666e-08 +
                local_f8 * -0.0007439885 + local_178 * -2.92664 + local_e0 * -922.7977 + -3.053888;
  }
  else {
    local_1f8 = dVar5 * -2.06743612e-14 +
                dVar4 * 7.896195275e-12 +
                dVar3 * 1.357169215e-07 +
                local_f8 * -0.000412472087 +
                dVar2 * -3.29812431 + local_e0 * -1012.52087 + 6.5922184;
    local_1f0 = local_158 * 4.38427696e-14 +
                local_160 * -1.094897691666667e-10 +
                local_168 * 9.593584116666666e-08 +
                local_f8 * -0.000563743175 +
                local_178 * -3.2129364 + local_e0 * -1005.24902 + -2.82180119;
    local_1e8 = local_158 * 1.253294235e-13 +
                local_160 * -5.807151058333333e-10 +
                local_168 * 1.059116055e-06 +
                local_f8 * -0.00173749123 +
                local_178 * -3.38684249 + local_e0 * -30208.1133 + 0.7966096399999998;
    local_1e0 = local_158 * -0.0 +
                local_160 * -0.0 +
                local_168 * -0.0 +
                local_f8 * -0.0 + local_178 * -2.5 + local_e0 * 25471.627 + 2.960117608;
    local_1d8 = local_158 * -1.94534818e-14 +
                local_160 * 1.335702658333333e-10 +
                local_168 * -4.035052833333333e-07 +
                local_f8 * 0.000819083245 +
                local_178 * -2.94642878 + local_e0 * 29147.6445 + -0.01756619999999964;
    local_1d0 = local_158 * -1.031186895e-13 +
                local_160 * 4.832113691666666e-10 +
                local_168 * -1.087941151666667e-06 +
                local_f8 * 0.001612724695 +
                local_178 * -4.12530561 + local_e0 * 3346.30913 + 4.81573857;
    local_1c8 = local_158 * -4.646125620000001e-13 +
                local_160 * 2.02303245e-09 +
                local_168 * -3.526381516666666e-06 +
                local_f8 * 0.002374560255 +
                local_178 * -4.30179801 + local_e0 * 294.80804 + 0.5851355599999999;
    local_1c0 = local_158 * -1.235757375e-13 +
                local_160 * 3.854837933333333e-10 +
                local_168 * 2.475020966666667e-08 +
                local_f8 * -0.003284612905 +
                local_178 * -3.38875365 + local_e0 * -17663.1465 + -3.39660955;
    local_1b8 = local_158 * 1.2224275e-13 +
                local_160 * -4.701262500000001e-10 +
                local_168 * 6.605369999999999e-07 +
                local_f8 * -0.00070412 +
                local_178 * -3.298677 + local_e0 * -1020.9 + -0.6516950000000001;
  }
  local_88 = &local_248;
  local_90 = &local_178;
  local_98 = local_f8;
  local_a0 = 1.0 / local_f8;
  if (1000.0 <= local_f8) {
    local_248 = local_a0 * -835.033997 +
                dVar5 * 3.16550358e-16 +
                dVar4 * -2.30789455e-12 +
                dVar3 * -1.8779429e-08 + local_f8 * 0.000350032206 + 2.99142337;
    local_240 = local_a0 * -1233.93018 +
                dVar5 * -2.27287062e-16 +
                dVar4 * 4.4382037e-12 +
                dVar3 * -4.19613997e-08 + local_f8 * 0.000306759845 + 3.69757819;
    local_238 = local_a0 * -29899.209 +
                dVar5 * -1.27832357e-15 +
                dVar4 * 3.00249098e-11 +
                dVar3 * -2.9100867e-07 + local_f8 * 0.00152814644 + 2.67214561;
    local_230 = local_a0 * 25471.627 +
                dVar5 * 0.0 + dVar4 * 0.0 + dVar3 * 0.0 + local_f8 * 0.0 + 2.5;
    local_228 = local_a0 * 29230.8027 +
                dVar5 * -8.736103e-17 +
                dVar4 * 1.13776685e-12 +
                dVar3 * -1.03426778e-09 + local_f8 * -1.37753096e-05 + 2.54205966;
    local_220 = local_a0 * 3683.62875 +
                dVar5 * -2.66391752e-16 +
                dVar4 * 7.63046685e-12 +
                dVar3 * -8.63609193e-08 + local_f8 * 0.00052825224 + 2.86472886;
    local_218 = local_a0 * 111.856713 +
                dVar5 * -2.1581707e-15 +
                dVar4 * 2.85615925e-11 +
                dVar3 * -2.11219383e-07 + local_f8 * 0.00111991006 + 4.0172109;
    local_210 = local_a0 * -18006.9609 +
                dVar5 * -2.86330712e-15 +
                dVar4 * 5.87225893e-11 +
                dVar3 * -4.9156294e-07 + local_f8 * 0.0021680682 + 4.57316685;
    local_208 = local_a0 * -922.7977 +
                dVar5 * -1.3506702e-15 +
                dVar4 * 2.52426e-11 + dVar3 * -1.89492033e-07 + local_f8 * 0.0007439885 + 2.92664;
  }
  else {
    local_248 = local_a0 * -1012.52087 +
                dVar5 * 8.26974448e-14 +
                dVar4 * -2.36885858e-11 +
                dVar3 * -2.71433843e-07 + local_f8 * 0.000412472087 + 3.29812431;
    local_240 = local_a0 * -1005.24902 +
                dVar5 * -1.75371078e-13 +
                dVar4 * 3.28469308e-10 +
                dVar3 * -1.91871682e-07 + local_f8 * 0.000563743175 + 3.2129364;
    local_238 = local_a0 * -30208.1133 +
                dVar5 * -5.01317694e-13 +
                dVar4 * 1.74214532e-09 +
                dVar3 * -2.11823211e-06 + local_f8 * 0.00173749123 + 3.38684249;
    local_230 = local_a0 * 25471.627 +
                dVar5 * 0.0 + dVar4 * 0.0 + dVar3 * 0.0 + local_f8 * 0.0 + 2.5;
    local_228 = local_a0 * 29147.6445 +
                dVar5 * 7.78139272e-14 +
                dVar4 * -4.00710797e-10 +
                dVar3 * 8.07010567e-07 + local_f8 * -0.000819083245 + 2.94642878;
    local_220 = local_a0 * 3346.30913 +
                dVar5 * 4.12474758e-13 +
                dVar4 * -1.44963411e-09 +
                dVar3 * 2.1758823e-06 + local_f8 * -0.0016127247 + 4.12530561;
    local_218 = local_a0 * 294.80804 +
                dVar5 * 1.85845025e-12 +
                dVar4 * -6.06909735e-09 +
                dVar3 * 7.05276303e-06 + local_f8 * -0.00237456025 + 4.30179801;
    local_210 = local_a0 * -17663.1465 +
                dVar5 * 4.9430295e-13 +
                dVar4 * -1.15645138e-09 +
                dVar3 * -4.95004193e-08 + local_f8 * 0.0032846129 + 3.38875365;
    local_208 = local_a0 * -1020.9 +
                dVar5 * -4.88971e-13 +
                dVar4 * 1.41037875e-09 + dVar3 * -1.321074e-06 + local_f8 * 0.00070412 + 3.298677;
  }
  local_178 = dVar2;
  local_168 = dVar3;
  local_160 = dVar4;
  local_158 = dVar5;
  local_3e0 = log(10.0);
  local_3e8 = log(10.0);
  local_3e8 = 1.0 / local_3e8;
  local_290 = local_f0[2] * 10.0 + local_f0[1] * -0.21999999999999997 + local_1a0 + *local_f0;
  local_250 = local_f0[1] * local_f0[3];
  local_258 = exp(local_178 * 0.6 + -(local_180 * 0.0));
  local_258 = local_258 * 1475000.0;
  local_298 = local_180 * 0.6 + local_188 * 0.0;
  local_338 = exp(local_178 * -1.72 + -(local_180 * 264.08810621431707));
  local_338 = local_338 * 6.366e+20;
  local_320 = ((local_290 * 1e-12) / local_258) * local_338;
  local_328 = local_320 / (local_320 + 1.0);
  local_2a0 = local_180 * -1.72 + local_188 * 264.08810621431707;
  local_3b0 = local_3e8 * (local_2a0 - local_298);
  local_3b8 = local_3b0 / (local_320 + 1.0);
  local_340 = log10(local_320);
  local_378 = exp(-local_f8 / 1e-30);
  local_378 = local_378 * 0.19999999999999996;
  local_380 = exp(-local_f8 / 1e+30);
  local_380 = local_380 * 0.8;
  local_388 = 0;
  local_390 = local_378 + local_380 + 0.0;
  local_348 = log10(local_390);
  local_350 = local_348 * -0.67 + -0.4;
  local_358 = local_348 * -1.27 + 0.75;
  local_360 = 1.0 / ((local_350 + local_340) * -0.14 + local_358);
  local_368 = (local_350 + local_340) * local_360;
  local_370 = 1.0 / (local_368 * local_368 + 1.0);
  local_330 = pow(10.0,local_348 * local_370);
  dVar2 = local_198;
  local_3c8 = (local_3e8 / local_390) * (-local_378 / 1e-30 - local_380 / 1e+30);
  local_3a8 = local_348 * 2.0 * local_370 * local_370 * local_368 * local_360;
  local_3d0 = -local_358 * local_3a8 * local_360;
  local_3a0 = local_3a8 * local_368;
  local_3c0 = local_3c8 * (local_3a0 * -1.27 + local_3d0 * -0.67 + local_370) +
              local_3d0 * local_3b0;
  local_268 = local_f0[6];
  local_398 = local_3d0;
  dVar3 = exp((local_1f0 + local_1e0) - local_1c8);
  local_270 = dVar2 * dVar3;
  dVar2 = local_258 / (dVar2 * dVar3);
  local_2a8 = local_180 * (-(local_240 + local_230) + local_218 + 1.0);
  local_2b0 = (local_298 - local_2a8) * dVar2;
  local_280 = local_258 * local_250 + -(dVar2 * local_268);
  local_288 = local_328 * local_330;
  local_278 = local_288 * local_280;
  local_3d8 = local_3e0 * (local_3b8 + local_3c0);
  local_2b8 = local_288 * (local_298 * local_258 * local_250 + -(local_2b0 * local_268)) +
              local_3d8 * local_278;
  local_148[1] = local_148[1] - local_278;
  local_148[3] = local_148[3] - local_278;
  local_148[6] = local_278 + local_148[6];
  local_258 = local_288 * local_258;
  local_260 = local_288 * dVar2;
  local_2c8 = (local_278 / local_290) * (1.0 / (local_320 + 1.0) + local_3d0);
  if (local_fc == 0) {
    local_318[0] = local_2c8 * 2.0;
    local_318[1] = local_2c8 * 0.78 + local_258 * local_f0[3];
    local_318[2] = local_2c8 * 11.0;
    local_318[3] = local_258 * local_f0[1] + local_2c8;
    local_318[4] = local_2c8;
    local_318[5] = local_2c8;
    local_318[6] = local_2c8 - local_288 * dVar2;
    local_318[7] = local_2c8;
    local_318[8] = local_2c8;
    for (local_3ec = 0; local_3ec < 9; local_3ec = local_3ec + 1) {
      iVar1 = local_3ec * 10 + 1;
      local_e8[iVar1] = local_e8[iVar1] - local_318[local_3ec];
      iVar1 = local_3ec * 10 + 3;
      local_e8[iVar1] = local_e8[iVar1] - local_318[local_3ec];
      iVar1 = local_3ec * 10 + 6;
      local_e8[iVar1] = local_318[local_3ec] + local_e8[iVar1];
    }
  }
  else {
    local_2c0 = local_2c8;
    local_e8[1] = local_e8[1] - local_2c8;
    local_e8[3] = local_e8[3] - local_2c0;
    local_e8[6] = local_2c0 + local_e8[6];
    local_2c0 = local_2c8 * -0.21999999999999997 + local_258 * local_f0[3];
    local_e8[0xb] = local_e8[0xb] - local_2c0;
    local_e8[0xd] = local_e8[0xd] - local_2c0;
    local_e8[0x10] = local_2c0 + local_e8[0x10];
    local_2c0 = local_2c8 * 10.0;
    local_e8[0x15] = local_e8[0x15] - local_2c0;
    local_e8[0x17] = local_e8[0x17] - local_2c0;
    local_e8[0x1a] = local_2c0 + local_e8[0x1a];
    local_2c0 = local_258 * local_f0[1];
    local_e8[0x1f] = local_e8[0x1f] - local_2c0;
    local_e8[0x21] = local_e8[0x21] - local_2c0;
    local_e8[0x24] = local_2c0 + local_e8[0x24];
    local_2c0 = -local_260;
    local_e8[0x3d] = local_e8[0x3d] - local_2c0;
    local_e8[0x3f] = local_e8[0x3f] - local_2c0;
    local_e8[0x42] = local_2c0 + local_e8[0x42];
  }
  local_e8[0x5b] = local_e8[0x5b] - local_2b8;
  local_e8[0x5d] = local_e8[0x5d] - local_2b8;
  local_e8[0x60] = local_2b8 + local_e8[0x60];
  local_290 = local_f0[2] * 11.0 + *local_f0 * 1.5 + local_1a0;
  local_250 = local_f0[7];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 24370.78312492259));
  local_258 = local_258 * 295100000000000.0;
  local_298 = local_180 * 0.0 + local_188 * 24370.78312492259;
  local_338 = exp(local_178 * 0.0 + -(local_180 * 22896.35829411476));
  local_338 = local_338 * 1.202e+17;
  local_320 = ((local_290 * 1e-06) / local_258) * local_338;
  local_328 = local_320 / (local_320 + 1.0);
  local_2a0 = local_180 * 0.0 + local_188 * 22896.35829411476;
  local_3b0 = local_3e8 * (local_2a0 - local_298);
  local_3b8 = local_3b0 / (local_320 + 1.0);
  local_340 = log10(local_320);
  local_378 = exp(-local_f8 / 1e-30);
  local_378 = local_378 * 0.5;
  local_380 = exp(-local_f8 / 1e+30);
  local_380 = local_380 * 0.5;
  local_388 = 0;
  local_390 = local_378 + local_380 + 0.0;
  local_348 = log10(local_390);
  local_350 = local_348 * -0.67 + -0.4;
  local_358 = local_348 * -1.27 + 0.75;
  local_360 = 1.0 / ((local_350 + local_340) * -0.14 + local_358);
  local_368 = (local_350 + local_340) * local_360;
  local_370 = 1.0 / (local_368 * local_368 + 1.0);
  local_330 = pow(10.0,local_348 * local_370);
  dVar2 = local_190;
  local_3c8 = (local_3e8 / local_390) * (-local_378 / 1e-30 - local_380 / 1e+30);
  local_3a8 = local_348 * 2.0 * local_370 * local_370 * local_368 * local_360;
  local_3d0 = -local_358 * local_3a8 * local_360;
  local_3a0 = local_3a8 * local_368;
  local_3c0 = local_3c8 * (local_3a0 * -1.27 + local_3d0 * -0.67 + local_370) +
              local_3d0 * local_3b0;
  local_268 = local_f0[5] * local_f0[5];
  local_398 = local_3d0;
  dVar3 = exp(local_1c0 - (local_1d0 + local_1d0));
  local_270 = dVar2 * dVar3;
  dVar2 = local_258 / (dVar2 * dVar3);
  local_2a8 = local_180 * ((local_220 + local_220 + -local_210) - 1.0);
  local_2b0 = (local_298 - local_2a8) * dVar2;
  local_280 = local_258 * local_250 + -(dVar2 * local_268);
  local_288 = local_328 * local_330;
  local_278 = local_288 * local_280;
  local_3d8 = local_3e0 * (local_3b8 + local_3c0);
  local_2b8 = local_288 * (local_298 * local_258 * local_250 + -(local_2b0 * local_268)) +
              local_3d8 * local_278;
  local_148[5] = local_278 + local_278 + local_148[5];
  local_148[7] = local_148[7] - local_278;
  local_258 = local_288 * local_258;
  local_260 = local_288 * dVar2;
  local_2c8 = (local_278 / local_290) * (1.0 / (local_320 + 1.0) + local_3d0);
  if (local_fc == 0) {
    local_318[0] = local_2c8 * 2.5;
    local_318[1] = local_2c8;
    local_318[2] = local_2c8 * 12.0;
    local_318[3] = local_2c8;
    local_318[4] = local_2c8;
    local_318[5] = -(local_288 * dVar2 * 2.0) * local_f0[5] + local_2c8;
    local_318[6] = local_2c8;
    local_318[7] = local_2c8 + local_258;
    local_318[8] = local_2c8;
    for (local_3f0 = 0; local_3f0 < 9; local_3f0 = local_3f0 + 1) {
      iVar1 = local_3f0 * 10 + 5;
      local_e8[iVar1] = local_318[local_3f0] + local_318[local_3f0] + local_e8[iVar1];
      iVar1 = local_3f0 * 10 + 7;
      local_e8[iVar1] = local_e8[iVar1] - local_318[local_3f0];
    }
  }
  else {
    local_2c0 = local_2c8 * 1.5;
    local_e8[5] = local_2c0 + local_2c0 + local_e8[5];
    local_e8[7] = local_e8[7] - local_2c0;
    local_2c0 = local_2c8 * 11.0;
    local_e8[0x19] = local_2c0 + local_2c0 + local_e8[0x19];
    local_e8[0x1b] = local_e8[0x1b] - local_2c0;
    local_2c0 = -local_260 * 2.0 * local_f0[5];
    local_e8[0x37] = local_2c0 + local_2c0 + local_e8[0x37];
    local_e8[0x39] = local_e8[0x39] - local_2c0;
    local_2c0 = local_258;
    local_e8[0x4b] = local_258 + local_258 + local_e8[0x4b];
    local_e8[0x4d] = local_e8[0x4d] - local_2c0;
  }
  local_e8[0x5f] = local_2b8 + local_2b8 + local_e8[0x5f];
  local_e8[0x61] = local_e8[0x61] - local_2b8;
  local_290 = local_f0[2] * 11.0 + *local_f0 * 1.5 + local_1a0;
  local_250 = *local_f0;
  local_258 = exp(local_178 * -1.4 + -(local_180 * 52525.755576696676));
  dVar2 = local_190;
  local_258 = local_258 * 45770000000000.0;
  local_298 = local_180 * -1.4 + local_188 * 52525.755576696676;
  local_268 = local_f0[3] * local_f0[3];
  dVar3 = exp(local_1f8 - (local_1e0 + local_1e0));
  local_270 = dVar2 * dVar3;
  dVar2 = local_258 / (dVar2 * dVar3);
  local_2a8 = local_180 * ((local_230 + local_230 + -local_248) - 1.0);
  local_2b0 = (local_298 - local_2a8) * dVar2;
  local_280 = local_258 * local_250 + -(dVar2 * local_268);
  local_278 = local_290 * local_280;
  local_2b8 = local_290 * (local_298 * local_258 * local_250 + -(local_2b0 * local_268));
  local_148[0] = local_148[0] - local_278;
  local_148[3] = local_278 + local_278 + local_148[3];
  local_258 = local_290 * local_258;
  local_260 = local_290 * dVar2;
  if (local_fc == 0) {
    local_318[0] = local_280 * 2.5 + local_258;
    local_318[1] = local_280;
    local_318[2] = local_280 * 12.0;
    local_318[3] = -(local_290 * dVar2 * 2.0) * local_f0[3] + local_280;
    local_318[4] = local_280;
    local_318[5] = local_280;
    local_318[6] = local_280;
    local_318[7] = local_280;
    local_318[8] = local_280;
    for (local_3f4 = 0; local_3f4 < 9; local_3f4 = local_3f4 + 1) {
      local_e8[local_3f4 * 10] = local_e8[local_3f4 * 10] - local_318[local_3f4];
      iVar1 = local_3f4 * 10 + 3;
      local_e8[iVar1] = local_318[local_3f4] + local_318[local_3f4] + local_e8[iVar1];
    }
  }
  else {
    local_2c0 = local_280 * 1.5 + local_258;
    *local_e8 = *local_e8 - local_2c0;
    local_e8[3] = local_2c0 + local_2c0 + local_e8[3];
    local_2c0 = local_280 * 11.0;
    local_e8[0x14] = local_e8[0x14] - local_2c0;
    local_e8[0x17] = local_2c0 + local_2c0 + local_e8[0x17];
    local_2c0 = -local_260 * 2.0 * local_f0[3];
    local_e8[0x1e] = local_e8[0x1e] - local_2c0;
    local_e8[0x21] = local_2c0 + local_2c0 + local_e8[0x21];
  }
  local_e8[0x5a] = local_e8[0x5a] - local_2b8;
  local_e8[0x5d] = local_2b8 + local_2b8 + local_e8[0x5d];
  local_290 = local_f0[2] * 11.0 + *local_f0 * 1.5 + local_1a0;
  local_250 = local_f0[4] * local_f0[4];
  local_258 = exp(local_178 * -0.5 + -(local_180 * 0.0));
  dVar2 = local_198;
  local_258 = local_258 * 6165.0;
  local_298 = local_180 * -0.5 + local_188 * 0.0;
  local_268 = local_f0[1];
  dVar3 = exp(local_1d8 + local_1d8 + -local_1f0);
  local_270 = dVar2 * dVar3;
  dVar2 = local_258 / (dVar2 * dVar3);
  local_2a8 = local_180 * ((local_240 - (local_228 + local_228)) + 1.0);
  local_2b0 = (local_298 - local_2a8) * dVar2;
  local_280 = local_258 * local_250 + -(dVar2 * local_268);
  local_278 = local_290 * local_280;
  local_2b8 = local_290 * (local_298 * local_258 * local_250 + -(local_2b0 * local_268));
  local_148[1] = local_278 + local_148[1];
  local_148[4] = local_148[4] - (local_278 + local_278);
  local_258 = local_290 * local_258;
  local_260 = local_290 * dVar2;
  if (local_fc == 0) {
    local_318[0] = local_280 * 2.5;
    local_318[1] = local_280 - local_290 * dVar2;
    local_318[2] = local_280 * 12.0;
    local_318[3] = local_280;
    local_318[4] = local_258 * 2.0 * local_f0[4] + local_280;
    local_318[5] = local_280;
    local_318[6] = local_280;
    local_318[7] = local_280;
    local_318[8] = local_280;
    for (local_3f8 = 0; local_3f8 < 9; local_3f8 = local_3f8 + 1) {
      iVar1 = local_3f8 * 10 + 1;
      local_e8[iVar1] = local_318[local_3f8] + local_e8[iVar1];
      iVar1 = local_3f8 * 10 + 4;
      local_e8[iVar1] = local_e8[iVar1] - (local_318[local_3f8] + local_318[local_3f8]);
    }
  }
  else {
    local_2c0 = local_280 * 1.5;
    local_e8[1] = local_2c0 + local_e8[1];
    local_e8[4] = local_e8[4] - (local_2c0 + local_2c0);
    local_2c0 = -local_260;
    local_e8[0xb] = local_2c0 + local_e8[0xb];
    local_e8[0xe] = local_e8[0xe] - (local_2c0 + local_2c0);
    local_2c0 = local_280 * 11.0;
    local_e8[0x15] = local_2c0 + local_e8[0x15];
    local_e8[0x18] = local_e8[0x18] - (local_2c0 + local_2c0);
    local_2c0 = local_258 * 2.0 * local_f0[4];
    local_e8[0x29] = local_2c0 + local_e8[0x29];
    local_e8[0x2c] = local_e8[0x2c] - (local_2c0 + local_2c0);
  }
  local_e8[0x5b] = local_2b8 + local_e8[0x5b];
  local_e8[0x5e] = local_e8[0x5e] - (local_2b8 + local_2b8);
  local_290 = local_f0[2] * 11.0 + *local_f0 * 1.5 + local_1a0;
  local_250 = local_f0[3] * local_f0[4];
  local_258 = exp(-(local_180 * 0.0) - local_178);
  dVar2 = local_198;
  local_258 = local_258 * 4714000.0;
  local_298 = local_188 * 0.0 - local_180;
  local_268 = local_f0[5];
  dVar3 = exp((local_1e0 + local_1d8) - local_1d0);
  local_270 = dVar2 * dVar3;
  dVar2 = local_258 / (dVar2 * dVar3);
  local_2a8 = local_180 * (-(local_230 + local_228) + local_220 + 1.0);
  local_2b0 = (local_298 - local_2a8) * dVar2;
  local_280 = local_258 * local_250 + -(dVar2 * local_268);
  local_278 = local_290 * local_280;
  local_2b8 = local_290 * (local_298 * local_258 * local_250 + -(local_2b0 * local_268));
  local_148[3] = local_148[3] - local_278;
  local_148[4] = local_148[4] - local_278;
  local_148[5] = local_278 + local_148[5];
  local_258 = local_290 * local_258;
  local_260 = local_290 * dVar2;
  if (local_fc == 0) {
    local_318[0] = local_280 * 2.5;
    local_318[1] = local_280;
    local_318[2] = local_280 * 12.0;
    local_318[3] = local_258 * local_f0[4] + local_280;
    local_318[4] = local_258 * local_f0[3] + local_280;
    local_318[5] = local_280 - local_290 * dVar2;
    local_318[6] = local_280;
    local_318[7] = local_280;
    local_318[8] = local_280;
    for (local_3fc = 0; local_3fc < 9; local_3fc = local_3fc + 1) {
      iVar1 = local_3fc * 10 + 3;
      local_e8[iVar1] = local_e8[iVar1] - local_318[local_3fc];
      iVar1 = local_3fc * 10 + 4;
      local_e8[iVar1] = local_e8[iVar1] - local_318[local_3fc];
      iVar1 = local_3fc * 10 + 5;
      local_e8[iVar1] = local_318[local_3fc] + local_e8[iVar1];
    }
  }
  else {
    local_2c0 = local_280 * 1.5;
    local_e8[3] = local_e8[3] - local_2c0;
    local_e8[4] = local_e8[4] - local_2c0;
    local_e8[5] = local_2c0 + local_e8[5];
    local_2c0 = local_280 * 11.0;
    local_e8[0x17] = local_e8[0x17] - local_2c0;
    local_e8[0x18] = local_e8[0x18] - local_2c0;
    local_e8[0x19] = local_2c0 + local_e8[0x19];
    local_2c0 = local_258 * local_f0[4];
    local_e8[0x21] = local_e8[0x21] - local_2c0;
    local_e8[0x22] = local_e8[0x22] - local_2c0;
    local_e8[0x23] = local_2c0 + local_e8[0x23];
    local_2c0 = local_258 * local_f0[3];
    local_e8[0x2b] = local_e8[0x2b] - local_2c0;
    local_e8[0x2c] = local_e8[0x2c] - local_2c0;
    local_e8[0x2d] = local_2c0 + local_e8[0x2d];
    local_2c0 = -local_260;
    local_e8[0x35] = local_e8[0x35] - local_2c0;
    local_e8[0x36] = local_e8[0x36] - local_2c0;
    local_e8[0x37] = local_2c0 + local_e8[0x37];
  }
  local_e8[0x5d] = local_e8[0x5d] - local_2b8;
  local_e8[0x5e] = local_e8[0x5e] - local_2b8;
  local_e8[0x5f] = local_2b8 + local_e8[0x5f];
  local_290 = local_f0[2] * 11.0 + *local_f0 * 1.5 + local_1a0;
  local_250 = local_f0[3] * local_f0[5];
  local_258 = exp(-(local_180 * 0.0) - (local_178 + local_178));
  dVar2 = local_198;
  local_258 = local_258 * 38000000000.0;
  local_298 = local_188 * 0.0 - (local_180 + local_180);
  local_268 = local_f0[2];
  dVar3 = exp(-local_1e8 + local_1e0 + local_1d0);
  local_270 = dVar2 * dVar3;
  dVar2 = local_258 / (dVar2 * dVar3);
  local_2a8 = local_180 * (-(local_230 + local_220) + local_238 + 1.0);
  local_2b0 = (local_298 - local_2a8) * dVar2;
  local_280 = local_258 * local_250 + -(dVar2 * local_268);
  local_278 = local_290 * local_280;
  local_2b8 = local_290 * (local_298 * local_258 * local_250 + -(local_2b0 * local_268));
  local_148[2] = local_278 + local_148[2];
  local_148[3] = local_148[3] - local_278;
  local_148[5] = local_148[5] - local_278;
  local_258 = local_290 * local_258;
  local_260 = local_290 * dVar2;
  if (local_fc == 0) {
    local_318[0] = local_280 * 2.5;
    local_318[1] = local_280;
    local_318[2] = local_280 * 12.0 + -(local_290 * dVar2);
    local_318[3] = local_258 * local_f0[5] + local_280;
    local_318[4] = local_280;
    local_318[5] = local_258 * local_f0[3] + local_280;
    local_318[6] = local_280;
    local_318[7] = local_280;
    local_318[8] = local_280;
    for (local_400 = 0; local_400 < 9; local_400 = local_400 + 1) {
      iVar1 = local_400 * 10 + 2;
      local_e8[iVar1] = local_318[local_400] + local_e8[iVar1];
      iVar1 = local_400 * 10 + 3;
      local_e8[iVar1] = local_e8[iVar1] - local_318[local_400];
      iVar1 = local_400 * 10 + 5;
      local_e8[iVar1] = local_e8[iVar1] - local_318[local_400];
    }
  }
  else {
    local_2c0 = local_280 * 1.5;
    local_e8[2] = local_2c0 + local_e8[2];
    local_e8[3] = local_e8[3] - local_2c0;
    local_e8[5] = local_e8[5] - local_2c0;
    local_2c0 = local_280 * 11.0 + -local_260;
    local_e8[0x16] = local_2c0 + local_e8[0x16];
    local_e8[0x17] = local_e8[0x17] - local_2c0;
    local_e8[0x19] = local_e8[0x19] - local_2c0;
    local_2c0 = local_258 * local_f0[5];
    local_e8[0x20] = local_2c0 + local_e8[0x20];
    local_e8[0x21] = local_e8[0x21] - local_2c0;
    local_e8[0x23] = local_e8[0x23] - local_2c0;
    local_2c0 = local_258 * local_f0[3];
    local_e8[0x34] = local_2c0 + local_e8[0x34];
    local_e8[0x35] = local_e8[0x35] - local_2c0;
    local_e8[0x37] = local_e8[0x37] - local_2c0;
  }
  local_e8[0x5c] = local_2b8 + local_e8[0x5c];
  local_e8[0x5d] = local_e8[0x5d] - local_2b8;
  local_e8[0x5f] = local_e8[0x5f] - local_2b8;
  local_250 = local_f0[1] * local_f0[3];
  local_258 = exp(local_178 * -0.406 + -(local_180 * 8352.893435692547));
  local_258 = local_258 * 3547000000.0;
  local_298 = local_180 * -0.406 + local_188 * 8352.893435692547;
  local_268 = local_f0[4] * local_f0[5];
  local_270 = exp(((local_1f0 + local_1e0) - local_1d8) - local_1d0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_240 + local_230) + local_228 + local_220);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[1] = local_148[1] - local_278;
  local_148[3] = local_148[3] - local_278;
  local_148[4] = local_278 + local_148[4];
  local_148[5] = local_278 + local_148[5];
  local_2c0 = local_258 * local_f0[3];
  local_e8[0xb] = local_e8[0xb] - local_2c0;
  local_e8[0xd] = local_e8[0xd] - local_2c0;
  local_e8[0xe] = local_2c0 + local_e8[0xe];
  local_e8[0xf] = local_2c0 + local_e8[0xf];
  local_2c0 = local_258 * local_f0[1];
  local_e8[0x1f] = local_e8[0x1f] - local_2c0;
  local_e8[0x21] = local_e8[0x21] - local_2c0;
  local_e8[0x22] = local_2c0 + local_e8[0x22];
  local_e8[0x23] = local_2c0 + local_e8[0x23];
  local_2c0 = -local_260 * local_f0[5];
  local_e8[0x29] = local_e8[0x29] - local_2c0;
  local_e8[0x2b] = local_e8[0x2b] - local_2c0;
  local_e8[0x2c] = local_2c0 + local_e8[0x2c];
  local_e8[0x2d] = local_2c0 + local_e8[0x2d];
  local_2c0 = -local_260 * local_f0[4];
  local_e8[0x33] = local_e8[0x33] - local_2c0;
  local_e8[0x35] = local_e8[0x35] - local_2c0;
  local_e8[0x36] = local_2c0 + local_e8[0x36];
  local_e8[0x37] = local_2c0 + local_e8[0x37];
  local_e8[0x5b] = local_e8[0x5b] - local_2b8;
  local_e8[0x5d] = local_e8[0x5d] - local_2b8;
  local_e8[0x5e] = local_2b8 + local_e8[0x5e];
  local_e8[0x5f] = local_2b8 + local_e8[0x5f];
  local_250 = *local_f0 * local_f0[4];
  local_258 = exp(local_178 * 2.67 + -(local_180 * 3165.232827911689));
  local_258 = local_258 * 0.0508;
  local_298 = local_180 * 2.67 + local_188 * 3165.232827911689;
  local_268 = local_f0[3] * local_f0[5];
  local_270 = exp(((local_1f8 - local_1e0) + local_1d8) - local_1d0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_248 + local_228) + local_230 + local_220);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[0] = local_148[0] - local_278;
  local_148[3] = local_278 + local_148[3];
  local_148[4] = local_148[4] - local_278;
  local_148[5] = local_278 + local_148[5];
  local_2c0 = local_258 * local_f0[4];
  *local_e8 = *local_e8 - local_2c0;
  local_e8[3] = local_2c0 + local_e8[3];
  local_e8[4] = local_e8[4] - local_2c0;
  local_e8[5] = local_2c0 + local_e8[5];
  local_2c0 = -local_260 * local_f0[5];
  local_e8[0x1e] = local_e8[0x1e] - local_2c0;
  local_e8[0x21] = local_2c0 + local_e8[0x21];
  local_e8[0x22] = local_e8[0x22] - local_2c0;
  local_e8[0x23] = local_2c0 + local_e8[0x23];
  local_2c0 = local_258 * *local_f0;
  local_e8[0x28] = local_e8[0x28] - local_2c0;
  local_e8[0x2b] = local_2c0 + local_e8[0x2b];
  local_e8[0x2c] = local_e8[0x2c] - local_2c0;
  local_e8[0x2d] = local_2c0 + local_e8[0x2d];
  local_2c0 = -local_260 * local_f0[3];
  local_e8[0x32] = local_e8[0x32] - local_2c0;
  local_e8[0x35] = local_2c0 + local_e8[0x35];
  local_e8[0x36] = local_e8[0x36] - local_2c0;
  local_e8[0x37] = local_2c0 + local_e8[0x37];
  local_e8[0x5a] = local_e8[0x5a] - local_2b8;
  local_e8[0x5d] = local_2b8 + local_e8[0x5d];
  local_e8[0x5e] = local_e8[0x5e] - local_2b8;
  local_e8[0x5f] = local_2b8 + local_e8[0x5f];
  local_250 = *local_f0 * local_f0[5];
  local_258 = exp(local_178 * 1.51 + -(local_180 * 1726.0331637101897));
  local_258 = local_258 * 216.0;
  local_298 = local_180 * 1.51 + local_188 * 1726.0331637101897;
  local_268 = local_f0[2] * local_f0[3];
  local_270 = exp(((local_1f8 - local_1e8) - local_1e0) + local_1d0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_248 + local_220) + local_238 + local_230);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[0] = local_148[0] - local_278;
  local_148[2] = local_278 + local_148[2];
  local_148[3] = local_278 + local_148[3];
  local_148[5] = local_148[5] - local_278;
  local_2c0 = local_258 * local_f0[5];
  *local_e8 = *local_e8 - local_2c0;
  local_e8[2] = local_2c0 + local_e8[2];
  local_e8[3] = local_2c0 + local_e8[3];
  local_e8[5] = local_e8[5] - local_2c0;
  local_2c0 = -local_260 * local_f0[3];
  local_e8[0x14] = local_e8[0x14] - local_2c0;
  local_e8[0x16] = local_2c0 + local_e8[0x16];
  local_e8[0x17] = local_2c0 + local_e8[0x17];
  local_e8[0x19] = local_e8[0x19] - local_2c0;
  local_2c0 = -local_260 * local_f0[2];
  local_e8[0x1e] = local_e8[0x1e] - local_2c0;
  local_e8[0x20] = local_2c0 + local_e8[0x20];
  local_e8[0x21] = local_2c0 + local_e8[0x21];
  local_e8[0x23] = local_e8[0x23] - local_2c0;
  local_2c0 = local_258 * *local_f0;
  local_e8[0x32] = local_e8[0x32] - local_2c0;
  local_e8[0x34] = local_2c0 + local_e8[0x34];
  local_e8[0x35] = local_2c0 + local_e8[0x35];
  local_e8[0x37] = local_e8[0x37] - local_2c0;
  local_e8[0x5a] = local_e8[0x5a] - local_2b8;
  local_e8[0x5c] = local_2b8 + local_e8[0x5c];
  local_e8[0x5d] = local_2b8 + local_e8[0x5d];
  local_e8[0x5f] = local_e8[0x5f] - local_2b8;
  local_250 = local_f0[2] * local_f0[4];
  local_258 = exp(local_178 * 2.02 + -(local_180 * 6743.103321783248));
  local_258 = local_258 * 2.97;
  local_298 = local_180 * 2.02 + local_188 * 6743.103321783248;
  local_268 = local_f0[5] * local_f0[5];
  local_270 = exp((local_1e8 + local_1d8) - (local_1d0 + local_1d0));
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (local_220 + local_220 + -(local_238 + local_228));
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[2] = local_148[2] - local_278;
  local_148[4] = local_148[4] - local_278;
  local_148[5] = local_278 + local_278 + local_148[5];
  local_2c0 = local_258 * local_f0[4];
  local_e8[0x16] = local_e8[0x16] - local_2c0;
  local_e8[0x18] = local_e8[0x18] - local_2c0;
  local_e8[0x19] = local_2c0 + local_2c0 + local_e8[0x19];
  local_2c0 = local_258 * local_f0[2];
  local_e8[0x2a] = local_e8[0x2a] - local_2c0;
  local_e8[0x2c] = local_e8[0x2c] - local_2c0;
  local_e8[0x2d] = local_2c0 + local_2c0 + local_e8[0x2d];
  local_2c0 = -local_260 * 2.0 * local_f0[5];
  local_e8[0x34] = local_e8[0x34] - local_2c0;
  local_e8[0x36] = local_e8[0x36] - local_2c0;
  local_e8[0x37] = local_2c0 + local_2c0 + local_e8[0x37];
  local_e8[0x5c] = local_e8[0x5c] - local_2b8;
  local_e8[0x5e] = local_e8[0x5e] - local_2b8;
  local_e8[0x5f] = local_2b8 + local_2b8 + local_e8[0x5f];
  local_250 = local_f0[3] * local_f0[6];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 414.1473159572846));
  local_258 = local_258 * 16600000.0;
  local_298 = local_180 * 0.0 + local_188 * 414.1473159572846;
  local_268 = *local_f0 * local_f0[1];
  local_270 = exp((-local_1f8 - local_1f0) + local_1e0 + local_1c8);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_230 + local_218) + local_248 + local_240);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[0] = local_278 + local_148[0];
  local_148[1] = local_278 + local_148[1];
  local_148[3] = local_148[3] - local_278;
  local_148[6] = local_148[6] - local_278;
  local_2c0 = -local_260 * local_f0[1];
  *local_e8 = local_2c0 + *local_e8;
  local_e8[1] = local_2c0 + local_e8[1];
  local_e8[3] = local_e8[3] - local_2c0;
  local_e8[6] = local_e8[6] - local_2c0;
  local_2c0 = -local_260 * *local_f0;
  local_e8[10] = local_2c0 + local_e8[10];
  local_e8[0xb] = local_2c0 + local_e8[0xb];
  local_e8[0xd] = local_e8[0xd] - local_2c0;
  local_e8[0x10] = local_e8[0x10] - local_2c0;
  local_2c0 = local_258 * local_f0[6];
  local_e8[0x1e] = local_2c0 + local_e8[0x1e];
  local_e8[0x1f] = local_2c0 + local_e8[0x1f];
  local_e8[0x21] = local_e8[0x21] - local_2c0;
  local_e8[0x24] = local_e8[0x24] - local_2c0;
  local_2c0 = local_258 * local_f0[3];
  local_e8[0x3c] = local_2c0 + local_e8[0x3c];
  local_e8[0x3d] = local_2c0 + local_e8[0x3d];
  local_e8[0x3f] = local_e8[0x3f] - local_2c0;
  local_e8[0x42] = local_e8[0x42] - local_2c0;
  local_e8[0x5a] = local_2b8 + local_e8[0x5a];
  local_e8[0x5b] = local_2b8 + local_e8[0x5b];
  local_e8[0x5d] = local_e8[0x5d] - local_2b8;
  local_e8[0x60] = local_e8[0x60] - local_2b8;
  local_250 = local_f0[3] * local_f0[6];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 148.4489164123924));
  local_258 = local_258 * 70790000.0;
  local_298 = local_180 * 0.0 + local_188 * 148.4489164123924;
  local_268 = local_f0[5] * local_f0[5];
  local_270 = exp((local_1e0 - (local_1d0 + local_1d0)) + local_1c8);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (local_220 + local_220 + -(local_230 + local_218));
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[3] = local_148[3] - local_278;
  local_148[5] = local_278 + local_278 + local_148[5];
  local_148[6] = local_148[6] - local_278;
  local_2c0 = local_258 * local_f0[6];
  local_e8[0x21] = local_e8[0x21] - local_2c0;
  local_e8[0x23] = local_2c0 + local_2c0 + local_e8[0x23];
  local_e8[0x24] = local_e8[0x24] - local_2c0;
  local_2c0 = -local_260 * 2.0 * local_f0[5];
  local_e8[0x35] = local_e8[0x35] - local_2c0;
  local_e8[0x37] = local_2c0 + local_2c0 + local_e8[0x37];
  local_e8[0x38] = local_e8[0x38] - local_2c0;
  local_2c0 = local_258 * local_f0[3];
  local_e8[0x3f] = local_e8[0x3f] - local_2c0;
  local_e8[0x41] = local_2c0 + local_2c0 + local_e8[0x41];
  local_e8[0x42] = local_e8[0x42] - local_2c0;
  local_e8[0x5d] = local_e8[0x5d] - local_2b8;
  local_e8[0x5f] = local_2b8 + local_2b8 + local_e8[0x5f];
  local_e8[0x60] = local_e8[0x60] - local_2b8;
  local_250 = local_f0[4] * local_f0[6];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 0.0));
  local_258 = local_258 * 32500000.0;
  local_298 = local_180 * 0.0 + local_188 * 0.0;
  local_268 = local_f0[1] * local_f0[5];
  local_270 = exp(((-local_1f0 + local_1d8) - local_1d0) + local_1c8);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_228 + local_218) + local_240 + local_220);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[1] = local_278 + local_148[1];
  local_148[4] = local_148[4] - local_278;
  local_148[5] = local_278 + local_148[5];
  local_148[6] = local_148[6] - local_278;
  local_2c0 = -local_260 * local_f0[5];
  local_e8[0xb] = local_2c0 + local_e8[0xb];
  local_e8[0xe] = local_e8[0xe] - local_2c0;
  local_e8[0xf] = local_2c0 + local_e8[0xf];
  local_e8[0x10] = local_e8[0x10] - local_2c0;
  local_2c0 = local_258 * local_f0[6];
  local_e8[0x29] = local_2c0 + local_e8[0x29];
  local_e8[0x2c] = local_e8[0x2c] - local_2c0;
  local_e8[0x2d] = local_2c0 + local_e8[0x2d];
  local_e8[0x2e] = local_e8[0x2e] - local_2c0;
  local_2c0 = -local_260 * local_f0[1];
  local_e8[0x33] = local_2c0 + local_e8[0x33];
  local_e8[0x36] = local_e8[0x36] - local_2c0;
  local_e8[0x37] = local_2c0 + local_e8[0x37];
  local_e8[0x38] = local_e8[0x38] - local_2c0;
  local_2c0 = local_258 * local_f0[4];
  local_e8[0x3d] = local_2c0 + local_e8[0x3d];
  local_e8[0x40] = local_e8[0x40] - local_2c0;
  local_e8[0x41] = local_2c0 + local_e8[0x41];
  local_e8[0x42] = local_e8[0x42] - local_2c0;
  local_e8[0x5b] = local_2b8 + local_e8[0x5b];
  local_e8[0x5e] = local_e8[0x5e] - local_2b8;
  local_e8[0x5f] = local_2b8 + local_e8[0x5f];
  local_e8[0x60] = local_e8[0x60] - local_2b8;
  local_250 = local_f0[5] * local_f0[6];
  local_258 = exp(local_178 * 0.0 + -(local_180 * -250.09868290494586));
  local_258 = local_258 * 28900000.0;
  local_298 = local_180 * 0.0 + local_188 * -250.09868290494586;
  local_268 = local_f0[1] * local_f0[2];
  local_270 = exp((-local_1f0 - local_1e8) + local_1d0 + local_1c8);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_220 + local_218) + local_240 + local_238);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[1] = local_278 + local_148[1];
  local_148[2] = local_278 + local_148[2];
  local_148[5] = local_148[5] - local_278;
  local_148[6] = local_148[6] - local_278;
  local_2c0 = -local_260 * local_f0[2];
  local_e8[0xb] = local_2c0 + local_e8[0xb];
  local_e8[0xc] = local_2c0 + local_e8[0xc];
  local_e8[0xf] = local_e8[0xf] - local_2c0;
  local_e8[0x10] = local_e8[0x10] - local_2c0;
  local_2c0 = -local_260 * local_f0[1];
  local_e8[0x15] = local_2c0 + local_e8[0x15];
  local_e8[0x16] = local_2c0 + local_e8[0x16];
  local_e8[0x19] = local_e8[0x19] - local_2c0;
  local_e8[0x1a] = local_e8[0x1a] - local_2c0;
  local_2c0 = local_258 * local_f0[6];
  local_e8[0x33] = local_2c0 + local_e8[0x33];
  local_e8[0x34] = local_2c0 + local_e8[0x34];
  local_e8[0x37] = local_e8[0x37] - local_2c0;
  local_e8[0x38] = local_e8[0x38] - local_2c0;
  local_2c0 = local_258 * local_f0[5];
  local_e8[0x3d] = local_2c0 + local_e8[0x3d];
  local_e8[0x3e] = local_2c0 + local_e8[0x3e];
  local_e8[0x41] = local_e8[0x41] - local_2c0;
  local_e8[0x42] = local_e8[0x42] - local_2c0;
  local_e8[0x5b] = local_2b8 + local_e8[0x5b];
  local_e8[0x5c] = local_2b8 + local_e8[0x5c];
  local_e8[0x5f] = local_e8[0x5f] - local_2b8;
  local_e8[0x60] = local_e8[0x60] - local_2b8;
  local_250 = local_f0[6] * local_f0[6];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 6029.542089672155));
  local_258 = local_258 * 420000000.0;
  local_298 = local_180 * 0.0 + local_188 * 6029.542089672155;
  local_268 = local_f0[1] * local_f0[7];
  local_270 = exp((local_1c8 + local_1c8 + -local_1f0) - local_1c0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * ((local_240 + local_210) - (local_218 + local_218));
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[1] = local_278 + local_148[1];
  local_148[6] = local_148[6] - (local_278 + local_278);
  local_148[7] = local_278 + local_148[7];
  local_2c0 = -local_260 * local_f0[7];
  local_e8[0xb] = local_2c0 + local_e8[0xb];
  local_e8[0x10] = local_e8[0x10] - (local_2c0 + local_2c0);
  local_e8[0x11] = local_2c0 + local_e8[0x11];
  local_2c0 = local_258 * 2.0 * local_f0[6];
  local_e8[0x3d] = local_2c0 + local_e8[0x3d];
  local_e8[0x42] = local_e8[0x42] - (local_2c0 + local_2c0);
  local_e8[0x43] = local_2c0 + local_e8[0x43];
  local_2c0 = -local_260 * local_f0[1];
  local_e8[0x47] = local_2c0 + local_e8[0x47];
  local_e8[0x4c] = local_e8[0x4c] - (local_2c0 + local_2c0);
  local_e8[0x4d] = local_2c0 + local_e8[0x4d];
  local_e8[0x5b] = local_2b8 + local_e8[0x5b];
  local_e8[0x60] = local_e8[0x60] - (local_2b8 + local_2b8);
  local_e8[0x61] = local_2b8 + local_e8[0x61];
  local_250 = local_f0[6] * local_f0[6];
  local_258 = exp(local_178 * 0.0 + -(local_180 * -819.8909135956303));
  local_258 = local_258 * 130000.0;
  local_298 = local_180 * 0.0 + local_188 * -819.8909135956303;
  local_268 = local_f0[1] * local_f0[7];
  local_270 = exp((local_1c8 + local_1c8 + -local_1f0) - local_1c0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * ((local_240 + local_210) - (local_218 + local_218));
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[1] = local_278 + local_148[1];
  local_148[6] = local_148[6] - (local_278 + local_278);
  local_148[7] = local_278 + local_148[7];
  local_2c0 = -local_260 * local_f0[7];
  local_e8[0xb] = local_2c0 + local_e8[0xb];
  local_e8[0x10] = local_e8[0x10] - (local_2c0 + local_2c0);
  local_e8[0x11] = local_2c0 + local_e8[0x11];
  local_2c0 = local_258 * 2.0 * local_f0[6];
  local_e8[0x3d] = local_2c0 + local_e8[0x3d];
  local_e8[0x42] = local_e8[0x42] - (local_2c0 + local_2c0);
  local_e8[0x43] = local_2c0 + local_e8[0x43];
  local_2c0 = -local_260 * local_f0[1];
  local_e8[0x47] = local_2c0 + local_e8[0x47];
  local_e8[0x4c] = local_e8[0x4c] - (local_2c0 + local_2c0);
  local_e8[0x4d] = local_2c0 + local_e8[0x4d];
  local_e8[0x5b] = local_2b8 + local_e8[0x5b];
  local_e8[0x60] = local_e8[0x60] - (local_2b8 + local_2b8);
  local_e8[0x61] = local_2b8 + local_e8[0x61];
  local_250 = local_f0[3] * local_f0[7];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 1997.7701632447386));
  local_258 = local_258 * 24100000.0;
  local_298 = local_180 * 0.0 + local_188 * 1997.7701632447386;
  local_268 = local_f0[2] * local_f0[5];
  local_270 = exp(((-local_1e8 + local_1e0) - local_1d0) + local_1c0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_230 + local_210) + local_238 + local_220);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[2] = local_278 + local_148[2];
  local_148[3] = local_148[3] - local_278;
  local_148[5] = local_278 + local_148[5];
  local_148[7] = local_148[7] - local_278;
  local_2c0 = -local_260 * local_f0[5];
  local_e8[0x16] = local_2c0 + local_e8[0x16];
  local_e8[0x17] = local_e8[0x17] - local_2c0;
  local_e8[0x19] = local_2c0 + local_e8[0x19];
  local_e8[0x1b] = local_e8[0x1b] - local_2c0;
  local_2c0 = local_258 * local_f0[7];
  local_e8[0x20] = local_2c0 + local_e8[0x20];
  local_e8[0x21] = local_e8[0x21] - local_2c0;
  local_e8[0x23] = local_2c0 + local_e8[0x23];
  local_e8[0x25] = local_e8[0x25] - local_2c0;
  local_2c0 = -local_260 * local_f0[2];
  local_e8[0x34] = local_2c0 + local_e8[0x34];
  local_e8[0x35] = local_e8[0x35] - local_2c0;
  local_e8[0x37] = local_2c0 + local_e8[0x37];
  local_e8[0x39] = local_e8[0x39] - local_2c0;
  local_2c0 = local_258 * local_f0[3];
  local_e8[0x48] = local_2c0 + local_e8[0x48];
  local_e8[0x49] = local_e8[0x49] - local_2c0;
  local_e8[0x4b] = local_2c0 + local_e8[0x4b];
  local_e8[0x4d] = local_e8[0x4d] - local_2c0;
  local_e8[0x5c] = local_2b8 + local_e8[0x5c];
  local_e8[0x5d] = local_e8[0x5d] - local_2b8;
  local_e8[0x5f] = local_2b8 + local_e8[0x5f];
  local_e8[0x61] = local_e8[0x61] - local_2b8;
  local_250 = local_f0[3] * local_f0[7];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 4000.5724931475243));
  local_258 = local_258 * 48200000.0;
  local_298 = local_180 * 0.0 + local_188 * 4000.5724931475243;
  local_268 = *local_f0 * local_f0[6];
  local_270 = exp(((-local_1f8 + local_1e0) - local_1c8) + local_1c0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_230 + local_210) + local_248 + local_218);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[0] = local_278 + local_148[0];
  local_148[3] = local_148[3] - local_278;
  local_148[6] = local_278 + local_148[6];
  local_148[7] = local_148[7] - local_278;
  local_2c0 = -local_260 * local_f0[6];
  *local_e8 = local_2c0 + *local_e8;
  local_e8[3] = local_e8[3] - local_2c0;
  local_e8[6] = local_2c0 + local_e8[6];
  local_e8[7] = local_e8[7] - local_2c0;
  local_2c0 = local_258 * local_f0[7];
  local_e8[0x1e] = local_2c0 + local_e8[0x1e];
  local_e8[0x21] = local_e8[0x21] - local_2c0;
  local_e8[0x24] = local_2c0 + local_e8[0x24];
  local_e8[0x25] = local_e8[0x25] - local_2c0;
  local_2c0 = -local_260 * *local_f0;
  local_e8[0x3c] = local_2c0 + local_e8[0x3c];
  local_e8[0x3f] = local_e8[0x3f] - local_2c0;
  local_e8[0x42] = local_2c0 + local_e8[0x42];
  local_e8[0x43] = local_e8[0x43] - local_2c0;
  local_2c0 = local_258 * local_f0[3];
  local_e8[0x46] = local_2c0 + local_e8[0x46];
  local_e8[0x49] = local_e8[0x49] - local_2c0;
  local_e8[0x4c] = local_2c0 + local_e8[0x4c];
  local_e8[0x4d] = local_e8[0x4d] - local_2c0;
  local_e8[0x5a] = local_2b8 + local_e8[0x5a];
  local_e8[0x5d] = local_e8[0x5d] - local_2b8;
  local_e8[0x60] = local_2b8 + local_e8[0x60];
  local_e8[0x61] = local_e8[0x61] - local_2b8;
  local_250 = local_f0[4] * local_f0[7];
  local_258 = exp(local_178 + local_178 + -(local_180 * 1997.7701632447386));
  local_258 = local_258 * 9.55;
  local_298 = local_180 + local_180 + local_188 * 1997.7701632447386;
  local_268 = local_f0[5] * local_f0[6];
  local_270 = exp(((local_1d8 - local_1d0) - local_1c8) + local_1c0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_228 + local_210) + local_220 + local_218);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[4] = local_148[4] - local_278;
  local_148[5] = local_278 + local_148[5];
  local_148[6] = local_278 + local_148[6];
  local_148[7] = local_148[7] - local_278;
  local_2c0 = local_258 * local_f0[7];
  local_e8[0x2c] = local_e8[0x2c] - local_2c0;
  local_e8[0x2d] = local_2c0 + local_e8[0x2d];
  local_e8[0x2e] = local_2c0 + local_e8[0x2e];
  local_e8[0x2f] = local_e8[0x2f] - local_2c0;
  local_2c0 = -local_260 * local_f0[6];
  local_e8[0x36] = local_e8[0x36] - local_2c0;
  local_e8[0x37] = local_2c0 + local_e8[0x37];
  local_e8[0x38] = local_2c0 + local_e8[0x38];
  local_e8[0x39] = local_e8[0x39] - local_2c0;
  local_2c0 = -local_260 * local_f0[5];
  local_e8[0x40] = local_e8[0x40] - local_2c0;
  local_e8[0x41] = local_2c0 + local_e8[0x41];
  local_e8[0x42] = local_2c0 + local_e8[0x42];
  local_e8[0x43] = local_e8[0x43] - local_2c0;
  local_2c0 = local_258 * local_f0[4];
  local_e8[0x4a] = local_e8[0x4a] - local_2c0;
  local_e8[0x4b] = local_2c0 + local_e8[0x4b];
  local_e8[0x4c] = local_2c0 + local_e8[0x4c];
  local_e8[0x4d] = local_e8[0x4d] - local_2c0;
  local_e8[0x5e] = local_e8[0x5e] - local_2b8;
  local_e8[0x5f] = local_2b8 + local_e8[0x5f];
  local_e8[0x60] = local_2b8 + local_e8[0x60];
  local_e8[0x61] = local_e8[0x61] - local_2b8;
  local_250 = local_f0[5] * local_f0[7];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 0.0));
  local_258 = local_258 * 1000000.0;
  local_298 = local_180 * 0.0 + local_188 * 0.0;
  local_268 = local_f0[2] * local_f0[6];
  local_270 = exp(((-local_1e8 + local_1d0) - local_1c8) + local_1c0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_220 + local_210) + local_238 + local_218);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[2] = local_278 + local_148[2];
  local_148[5] = local_148[5] - local_278;
  local_148[6] = local_278 + local_148[6];
  local_148[7] = local_148[7] - local_278;
  local_2c0 = -local_260 * local_f0[6];
  local_e8[0x16] = local_2c0 + local_e8[0x16];
  local_e8[0x19] = local_e8[0x19] - local_2c0;
  local_e8[0x1a] = local_2c0 + local_e8[0x1a];
  local_e8[0x1b] = local_e8[0x1b] - local_2c0;
  local_2c0 = local_258 * local_f0[7];
  local_e8[0x34] = local_2c0 + local_e8[0x34];
  local_e8[0x37] = local_e8[0x37] - local_2c0;
  local_e8[0x38] = local_2c0 + local_e8[0x38];
  local_e8[0x39] = local_e8[0x39] - local_2c0;
  local_2c0 = -local_260 * local_f0[2];
  local_e8[0x3e] = local_2c0 + local_e8[0x3e];
  local_e8[0x41] = local_e8[0x41] - local_2c0;
  local_e8[0x42] = local_2c0 + local_e8[0x42];
  local_e8[0x43] = local_e8[0x43] - local_2c0;
  local_2c0 = local_258 * local_f0[5];
  local_e8[0x48] = local_2c0 + local_e8[0x48];
  local_e8[0x4b] = local_e8[0x4b] - local_2c0;
  local_e8[0x4c] = local_2c0 + local_e8[0x4c];
  local_e8[0x4d] = local_e8[0x4d] - local_2c0;
  local_e8[0x5c] = local_2b8 + local_e8[0x5c];
  local_e8[0x5f] = local_e8[0x5f] - local_2b8;
  local_e8[0x60] = local_2b8 + local_e8[0x60];
  local_e8[0x61] = local_e8[0x61] - local_2b8;
  local_250 = local_f0[5] * local_f0[7];
  local_258 = exp(local_178 * 0.0 + -(local_180 * 4809.241675095709));
  local_258 = local_258 * 580000000.0;
  local_298 = local_180 * 0.0 + local_188 * 4809.241675095709;
  local_268 = local_f0[2] * local_f0[6];
  local_270 = exp(((-local_1e8 + local_1d0) - local_1c8) + local_1c0);
  local_260 = local_258 / local_270;
  local_2a8 = local_180 * (-(local_220 + local_210) + local_238 + local_218);
  local_2b0 = (local_298 - local_2a8) * local_260;
  local_278 = local_258 * local_250 + -(local_260 * local_268);
  local_2b8 = local_298 * local_258 * local_250 + -(local_2b0 * local_268);
  local_148[2] = local_278 + local_148[2];
  local_148[5] = local_148[5] - local_278;
  local_148[6] = local_278 + local_148[6];
  local_148[7] = local_148[7] - local_278;
  local_2c0 = -local_260 * local_f0[6];
  local_e8[0x16] = local_2c0 + local_e8[0x16];
  local_e8[0x19] = local_e8[0x19] - local_2c0;
  local_e8[0x1a] = local_2c0 + local_e8[0x1a];
  local_e8[0x1b] = local_e8[0x1b] - local_2c0;
  local_2c0 = local_258 * local_f0[7];
  local_e8[0x34] = local_2c0 + local_e8[0x34];
  local_e8[0x37] = local_e8[0x37] - local_2c0;
  local_e8[0x38] = local_2c0 + local_e8[0x38];
  local_e8[0x39] = local_e8[0x39] - local_2c0;
  local_2c0 = -local_260 * local_f0[2];
  local_e8[0x3e] = local_2c0 + local_e8[0x3e];
  local_e8[0x41] = local_e8[0x41] - local_2c0;
  local_e8[0x42] = local_2c0 + local_e8[0x42];
  local_e8[0x43] = local_e8[0x43] - local_2c0;
  local_2c0 = local_258 * local_f0[5];
  local_e8[0x48] = local_258 * local_f0[5] + local_e8[0x48];
  local_e8[0x4b] = local_e8[0x4b] - local_2c0;
  local_e8[0x4c] = local_2c0 + local_e8[0x4c];
  local_e8[0x4d] = local_e8[0x4d] - local_2c0;
  local_e8[0x5c] = local_2b8 + local_e8[0x5c];
  local_e8[0x5f] = local_e8[0x5f] - local_2b8;
  local_e8[0x60] = local_2b8 + local_e8[0x60];
  local_e8[0x61] = local_e8[0x61] - local_2b8;
  if (local_fc == 0) {
    local_28 = local_448;
    local_30 = &local_178;
    local_38 = local_170;
    if (1000.0 <= local_170) {
      local_448[0] = local_158 * 1.58275179e-15 +
                     local_160 * -9.23157818e-12 +
                     local_168 * -5.63382869e-08 + local_170 * 0.000700064411 + 1.99142337;
      local_448[1] = local_158 * -1.13643531e-15 +
                     local_160 * 1.77528148e-11 +
                     local_168 * -1.25884199e-07 + local_170 * 0.000613519689 + 2.69757819;
      local_448[2] = local_158 * -6.39161787e-15 +
                     local_160 * 1.20099639e-10 +
                     local_168 * -8.73026011e-07 + local_170 * 0.00305629289 + 1.67214561;
      local_448[3] = local_158 * 0.0 + local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 1.5;
      local_448[4] = local_158 * -4.3680515e-16 +
                     local_160 * 4.55106742e-12 +
                     local_168 * -3.10280335e-09 + local_170 * -2.75506191e-05 + 1.54205966;
      local_448[5] = local_158 * -1.33195876e-15 +
                     local_160 * 3.05218674e-11 +
                     local_168 * -2.59082758e-07 + local_170 * 0.00105650448 + 1.86472886;
      local_448[6] = local_158 * -1.07908535e-14 +
                     local_160 * 1.1424637e-10 +
                     local_168 * -6.3365815e-07 + local_170 * 0.00223982013 + 3.0172109;
      local_448[7] = local_158 * -1.43165356e-14 +
                     local_160 * 2.34890357e-10 +
                     local_168 * -1.47468882e-06 + local_170 * 0.00433613639 + 3.57316685;
      local_448[8] = local_158 * -6.753351e-15 +
                     local_160 * 1.009704e-10 +
                     local_168 * -5.684761e-07 + local_170 * 0.001487977 + 1.92664;
      local_498[0] = local_160 * 6.33100716e-15 +
                     local_168 * -2.76947345e-11 + local_170 * -1.12676574e-07 + 0.000700064411;
      local_498[1] = local_160 * -4.54574124e-15 +
                     local_168 * 5.32584444e-11 + local_170 * -2.51768398e-07 + 0.000613519689;
      local_498[2] = local_160 * -2.55664715e-14 +
                     local_168 * 3.60298917e-10 + local_170 * -1.74605202e-06 + 0.00305629289;
      local_498[3] = local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 0.0;
      local_498[4] = local_160 * -1.7472206e-15 +
                     local_168 * 1.36532023e-11 + local_170 * -6.2056067e-09 + -2.75506191e-05;
      local_498[5] = local_160 * -5.32783504e-15 +
                     local_168 * 9.15656022e-11 + local_170 * -5.18165516e-07 + 0.00105650448;
      local_498[6] = local_160 * -4.3163414e-14 +
                     local_168 * 3.4273911e-10 + local_170 * -1.2673163e-06 + 0.00223982013;
      local_498[7] = local_160 * -5.72661424e-14 +
                     local_168 * 7.04671071e-10 + local_170 * -2.94937764e-06 + 0.00433613639;
      local_498[8] = local_160 * -2.7013404e-14 +
                     local_168 * 3.029112e-10 + local_170 * -1.1369522e-06 + 0.001487977;
    }
    else {
      local_448[0] = local_158 * 4.13487224e-13 +
                     local_160 * -9.47543433e-11 +
                     local_168 * -8.14301529e-07 + local_170 * 0.000824944174 + 2.29812431;
      local_448[1] = local_158 * -8.76855392e-13 +
                     local_160 * 1.31387723e-09 +
                     local_168 * -5.75615047e-07 + local_170 * 0.00112748635 + 2.2129364;
      local_448[2] = local_158 * -2.50658847e-12 +
                     local_160 * 6.96858127e-09 +
                     local_168 * -6.35469633e-06 + local_170 * 0.00347498246 + 2.38684249;
      local_448[3] = local_158 * 0.0 + local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 1.5;
      local_448[4] = local_158 * 3.89069636e-13 +
                     local_160 * -1.60284319e-09 +
                     local_168 * 2.4210317e-06 + local_170 * -0.00163816649 + 1.94642878;
      local_448[5] = local_158 * 2.06237379e-12 +
                     local_160 * -5.79853643e-09 +
                     local_168 * 6.52764691e-06 + local_170 * -0.00322544939 + 3.12530561;
      local_448[6] = local_158 * 9.29225124e-12 +
                     local_160 * -2.42763894e-08 +
                     local_168 * 2.11582891e-05 + local_170 * -0.00474912051 + 3.30179801;
      local_448[7] = local_158 * 2.47151475e-12 +
                     local_160 * -4.62580552e-09 +
                     local_168 * -1.48501258e-07 + local_170 * 0.00656922581 + 2.38875365;
      local_448[8] = local_158 * -2.444855e-12 +
                     local_160 * 5.641515e-09 +
                     local_168 * -3.963222e-06 + local_170 * 0.00140824 + 2.298677;
      local_498[0] = local_160 * 1.6539489e-12 +
                     local_168 * -2.8426303e-10 + local_170 * -1.62860306e-06 + 0.000824944174;
      local_498[1] = local_160 * -3.50742157e-12 +
                     local_168 * 3.94163169e-09 + local_170 * -1.15123009e-06 + 0.00112748635;
      local_498[2] = local_160 * -1.00263539e-11 +
                     local_168 * 2.09057438e-08 + local_170 * -1.27093927e-05 + 0.00347498246;
      local_498[3] = local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 0.0;
      local_498[4] = local_160 * 1.55627854e-12 +
                     local_168 * -4.80852957e-09 + local_170 * 4.8420634e-06 + -0.00163816649;
      local_498[5] = local_160 * 8.24949516e-12 +
                     local_168 * -1.73956093e-08 + local_170 * 1.30552938e-05 + -0.00322544939;
      local_498[6] = local_160 * 3.7169005e-11 +
                     local_168 * -7.28291682e-08 + local_170 * 4.23165782e-05 + -0.00474912051;
      local_498[7] = local_160 * 9.886059e-12 +
                     local_168 * -1.38774166e-08 + local_170 * -2.97002516e-07 + 0.00656922581;
      local_498[8] = local_160 * -9.77942e-12 +
                     local_168 * 1.6924545e-08 + local_170 * -7.926444e-06 + 0.00140824;
    }
    local_8 = &local_4e8;
    local_10 = &local_178;
    local_18 = local_170;
    local_20 = 1.0 / local_170;
    if (1000.0 <= local_170) {
      local_4e8 = local_20 * -835.033997 +
                  local_158 * 3.16550358e-16 +
                  local_160 * -2.30789455e-12 +
                  local_168 * -1.8779429e-08 + local_170 * 0.000350032206 + 1.99142337;
      local_4e0 = local_20 * -1233.93018 +
                  local_158 * -2.27287062e-16 +
                  local_160 * 4.4382037e-12 +
                  local_168 * -4.19613997e-08 + local_170 * 0.000306759845 + 2.69757819;
      local_4d8 = local_20 * -29899.209 +
                  local_158 * -1.27832357e-15 +
                  local_160 * 3.00249098e-11 +
                  local_168 * -2.9100867e-07 + local_170 * 0.00152814644 + 1.67214561;
      local_4d0 = local_20 * 25471.627 +
                  local_158 * 0.0 + local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 1.5;
      local_4c8 = local_20 * 29230.8027 +
                  local_158 * -8.736103e-17 +
                  local_160 * 1.13776685e-12 +
                  local_168 * -1.03426778e-09 + local_170 * -1.37753096e-05 + 1.54205966;
      local_4c0 = local_20 * 3683.62875 +
                  local_158 * -2.66391752e-16 +
                  local_160 * 7.63046685e-12 +
                  local_168 * -8.63609193e-08 + local_170 * 0.00052825224 + 1.86472886;
      local_4b8 = local_20 * 111.856713 +
                  local_158 * -2.1581707e-15 +
                  local_160 * 2.85615925e-11 +
                  local_168 * -2.11219383e-07 + local_170 * 0.00111991006 + 3.0172109;
      local_4b0 = local_20 * -18006.9609 +
                  local_158 * -2.86330712e-15 +
                  local_160 * 5.87225893e-11 +
                  local_168 * -4.9156294e-07 + local_170 * 0.0021680682 + 3.57316685;
      local_4a8 = local_20 * -922.7977 +
                  local_158 * -1.3506702e-15 +
                  local_160 * 2.52426e-11 +
                  local_168 * -1.89492033e-07 + local_170 * 0.0007439885 + 1.92664;
    }
    else {
      local_4e8 = local_20 * -1012.52087 +
                  local_158 * 8.26974448e-14 +
                  local_160 * -2.36885858e-11 +
                  local_168 * -2.71433843e-07 + local_170 * 0.000412472087 + 2.29812431;
      local_4e0 = local_20 * -1005.24902 +
                  local_158 * -1.75371078e-13 +
                  local_160 * 3.28469308e-10 +
                  local_168 * -1.91871682e-07 + local_170 * 0.000563743175 + 2.2129364;
      local_4d8 = local_20 * -30208.1133 +
                  local_158 * -5.01317694e-13 +
                  local_160 * 1.74214532e-09 +
                  local_168 * -2.11823211e-06 + local_170 * 0.00173749123 + 2.38684249;
      local_4d0 = local_20 * 25471.627 +
                  local_158 * 0.0 + local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 1.5;
      local_4c8 = local_20 * 29147.6445 +
                  local_158 * 7.78139272e-14 +
                  local_160 * -4.00710797e-10 +
                  local_168 * 8.07010567e-07 + local_170 * -0.000819083245 + 1.94642878;
      local_4c0 = local_20 * 3346.30913 +
                  local_158 * 4.12474758e-13 +
                  local_160 * -1.44963411e-09 +
                  local_168 * 2.1758823e-06 + local_170 * -0.0016127247 + 3.12530561;
      local_4b8 = local_20 * 294.80804 +
                  local_158 * 1.85845025e-12 +
                  local_160 * -6.06909735e-09 +
                  local_168 * 7.05276303e-06 + local_170 * -0.00237456025 + 3.30179801;
      local_4b0 = local_20 * -17663.1465 +
                  local_158 * 4.9430295e-13 +
                  local_160 * -1.15645138e-09 +
                  local_168 * -4.95004193e-08 + local_170 * 0.0032846129 + 2.38875365;
      local_4a8 = local_20 * -1020.9 +
                  local_158 * -4.88971e-13 +
                  local_160 * 1.41037875e-09 +
                  local_168 * -1.321074e-06 + local_170 * 0.00070412 + 2.298677;
    }
    local_4f0 = &local_4e8;
  }
  else {
    local_70 = local_448;
    local_78 = &local_178;
    local_80 = local_170;
    if (1000.0 <= local_170) {
      local_448[0] = local_158 * 1.58275179e-15 +
                     local_160 * -9.23157818e-12 +
                     local_168 * -5.63382869e-08 + local_170 * 0.000700064411 + 2.99142337;
      local_448[1] = local_158 * -1.13643531e-15 +
                     local_160 * 1.77528148e-11 +
                     local_168 * -1.25884199e-07 + local_170 * 0.000613519689 + 3.69757819;
      local_448[2] = local_158 * -6.39161787e-15 +
                     local_160 * 1.20099639e-10 +
                     local_168 * -8.73026011e-07 + local_170 * 0.00305629289 + 2.67214561;
      local_448[3] = local_158 * 0.0 + local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 2.5;
      local_448[4] = local_158 * -4.3680515e-16 +
                     local_160 * 4.55106742e-12 +
                     local_168 * -3.10280335e-09 + local_170 * -2.75506191e-05 + 2.54205966;
      local_448[5] = local_158 * -1.33195876e-15 +
                     local_160 * 3.05218674e-11 +
                     local_168 * -2.59082758e-07 + local_170 * 0.00105650448 + 2.86472886;
      local_448[6] = local_158 * -1.07908535e-14 +
                     local_160 * 1.1424637e-10 +
                     local_168 * -6.3365815e-07 + local_170 * 0.00223982013 + 4.0172109;
      local_448[7] = local_158 * -1.43165356e-14 +
                     local_160 * 2.34890357e-10 +
                     local_168 * -1.47468882e-06 + local_170 * 0.00433613639 + 4.57316685;
      local_448[8] = local_158 * -6.753351e-15 +
                     local_160 * 1.009704e-10 +
                     local_168 * -5.684761e-07 + local_170 * 0.001487977 + 2.92664;
      local_498[0] = local_160 * 6.33100716e-15 +
                     local_168 * -2.76947345e-11 + local_170 * -1.12676574e-07 + 0.000700064411;
      local_498[1] = local_160 * -4.54574124e-15 +
                     local_168 * 5.32584444e-11 + local_170 * -2.51768398e-07 + 0.000613519689;
      local_498[2] = local_160 * -2.55664715e-14 +
                     local_168 * 3.60298917e-10 + local_170 * -1.74605202e-06 + 0.00305629289;
      local_498[3] = local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 0.0;
      local_498[4] = local_160 * -1.7472206e-15 +
                     local_168 * 1.36532023e-11 + local_170 * -6.2056067e-09 + -2.75506191e-05;
      local_498[5] = local_160 * -5.32783504e-15 +
                     local_168 * 9.15656022e-11 + local_170 * -5.18165516e-07 + 0.00105650448;
      local_498[6] = local_160 * -4.3163414e-14 +
                     local_168 * 3.4273911e-10 + local_170 * -1.2673163e-06 + 0.00223982013;
      local_498[7] = local_160 * -5.72661424e-14 +
                     local_168 * 7.04671071e-10 + local_170 * -2.94937764e-06 + 0.00433613639;
      local_498[8] = local_160 * -2.7013404e-14 +
                     local_168 * 3.029112e-10 + local_170 * -1.1369522e-06 + 0.001487977;
    }
    else {
      local_448[0] = local_158 * 4.13487224e-13 +
                     local_160 * -9.47543433e-11 +
                     local_168 * -8.14301529e-07 + local_170 * 0.000824944174 + 3.29812431;
      local_448[1] = local_158 * -8.76855392e-13 +
                     local_160 * 1.31387723e-09 +
                     local_168 * -5.75615047e-07 + local_170 * 0.00112748635 + 3.2129364;
      local_448[2] = local_158 * -2.50658847e-12 +
                     local_160 * 6.96858127e-09 +
                     local_168 * -6.35469633e-06 + local_170 * 0.00347498246 + 3.38684249;
      local_448[3] = local_158 * 0.0 + local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 2.5;
      local_448[4] = local_158 * 3.89069636e-13 +
                     local_160 * -1.60284319e-09 +
                     local_168 * 2.4210317e-06 + local_170 * -0.00163816649 + 2.94642878;
      local_448[5] = local_158 * 2.06237379e-12 +
                     local_160 * -5.79853643e-09 +
                     local_168 * 6.52764691e-06 + local_170 * -0.00322544939 + 4.12530561;
      local_448[6] = local_158 * 9.29225124e-12 +
                     local_160 * -2.42763894e-08 +
                     local_168 * 2.11582891e-05 + local_170 * -0.00474912051 + 4.30179801;
      local_448[7] = local_158 * 2.47151475e-12 +
                     local_160 * -4.62580552e-09 +
                     local_168 * -1.48501258e-07 + local_170 * 0.00656922581 + 3.38875365;
      local_448[8] = local_158 * -2.444855e-12 +
                     local_160 * 5.641515e-09 +
                     local_168 * -3.963222e-06 + local_170 * 0.00140824 + 3.298677;
      local_498[0] = local_160 * 1.6539489e-12 +
                     local_168 * -2.8426303e-10 + local_170 * -1.62860306e-06 + 0.000824944174;
      local_498[1] = local_160 * -3.50742157e-12 +
                     local_168 * 3.94163169e-09 + local_170 * -1.15123009e-06 + 0.00112748635;
      local_498[2] = local_160 * -1.00263539e-11 +
                     local_168 * 2.09057438e-08 + local_170 * -1.27093927e-05 + 0.00347498246;
      local_498[3] = local_160 * 0.0 + local_168 * 0.0 + local_170 * 0.0 + 0.0;
      local_498[4] = local_160 * 1.55627854e-12 +
                     local_168 * -4.80852957e-09 + local_170 * 4.8420634e-06 + -0.00163816649;
      local_498[5] = local_160 * 8.24949516e-12 +
                     local_168 * -1.73956093e-08 + local_170 * 1.30552938e-05 + -0.00322544939;
      local_498[6] = local_160 * 3.7169005e-11 +
                     local_168 * -7.28291682e-08 + local_170 * 4.23165782e-05 + -0.00474912051;
      local_498[7] = local_160 * 9.886059e-12 +
                     local_168 * -1.38774166e-08 + local_170 * -2.97002516e-07 + 0.00656922581;
      local_498[8] = local_160 * -9.77942e-12 +
                     local_168 * 1.6924545e-08 + local_170 * -7.926444e-06 + 0.00140824;
    }
    local_4f0 = &local_248;
  }
  local_4f8 = 0.0;
  local_500 = 0.0;
  local_508 = 0.0;
  local_510 = 0.0;
  for (local_514 = 0; local_514 < 9; local_514 = local_514 + 1) {
    local_4f8 = local_448[local_514] * local_f0[local_514] + local_4f8;
    local_508 = local_498[local_514] * local_f0[local_514] + local_508;
    local_500 = local_4f0[local_514] * local_148[local_514] + local_500;
    local_510 = local_180 * (local_448[local_514] - local_4f0[local_514]) * local_148[local_514] +
                local_4f0[local_514] * local_e8[local_514 + 0x5a] + local_510;
  }
  local_520 = 1.0 / local_4f8;
  dVar2 = local_500 * local_520;
  local_528 = dVar2;
  dVar3 = local_520 * local_f8;
  local_530 = dVar3;
  dVar4 = dVar2 * dVar3;
  local_538 = dVar4;
  for (local_544 = 0; local_544 < 9; local_544 = local_544 + 1) {
    local_540 = 0.0;
    for (local_548 = 0; local_548 < 9; local_548 = local_548 + 1) {
      local_540 = local_4f0[local_548] * local_e8[local_544 * 10 + local_548] + local_540;
    }
    local_e8[local_544 * 10 + 9] = dVar4 * local_448[local_544] + -(dVar3 * local_540);
  }
  local_e8[99] = -dVar3 * local_510 + dVar4 * local_508 + -dVar2;
  local_8f0 = 0;
  for (local_8f4 = 0; local_8f4 < 10; local_8f4 = local_8f4 + 1) {
    for (local_8f8 = 0; local_8f8 < 10; local_8f8 = local_8f8 + 1) {
      if ((local_8a0[local_8f4 * 10 + local_8f8] != 0.0) ||
         (NAN(local_8a0[local_8f4 * 10 + local_8f8]))) {
        local_8f0 = local_8f0 + 1;
      }
    }
  }
  *local_570 = local_57c * local_8f0;
  return;
}

Assistant:

void
SPARSITY_INFO(int* nJdata, const int* consP, int NCELLS)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  int nJdata_tmp = 0;
  for (int k = 0; k < 10; k++) {
    for (int l = 0; l < 10; l++) {
      if (Jac[10 * k + l] != 0.0) {
        nJdata_tmp = nJdata_tmp + 1;
      }
    }
  }

  *nJdata = NCELLS * nJdata_tmp;
}